

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O0

DestructuringDecl * __thiscall SQASTReader::readDestructuringDecl(SQASTReader *this)

{
  int8_t iVar1;
  SQASTReader *this_00;
  DeclGroup *in_RDI;
  SQASTReader *unaff_retaddr;
  DestructuringType type;
  DestructuringDecl *g;
  InputStream *in_stack_ffffffffffffffe0;
  undefined8 in_stack_fffffffffffffff0;
  SQASTReader *pSVar2;
  DeclGroup *g_00;
  
  g_00 = in_RDI;
  this_00 = (SQASTReader *)
            newNode<SQCompilation::DestructuringDecl,Arena*,SQCompilation::DestructuringType>
                      (unaff_retaddr,(Arena *)in_RDI,
                       (DestructuringType)((ulong)in_stack_fffffffffffffff0 >> 0x20));
  readDeclGroupBody(unaff_retaddr,g_00);
  iVar1 = InputStream::readInt8(in_stack_ffffffffffffffe0);
  SQCompilation::DestructuringDecl::setType((DestructuringDecl *)this_00,(int)iVar1);
  pSVar2 = this_00;
  readExpression(this_00);
  SQCompilation::DestructuringDecl::setExpression((DestructuringDecl *)this_00,(Expr *)in_RDI);
  return (DestructuringDecl *)pSVar2;
}

Assistant:

DestructuringDecl *SQASTReader::readDestructuringDecl() {
  DestructuringDecl *g = newNode<DestructuringDecl>(astArena, DT_TABLE);

  readDeclGroupBody(g);

  enum DestructuringType type = (enum DestructuringType)stream->readInt8();

  g->setType(type);
  g->setExpression(readExpression());

  return g;
}